

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.h
# Opt level: O0

void __thiscall
embree::VerifyApplication::IntersectTest::IntersectTest
          (IntersectTest *this,string *name,int sse2,IntersectMode imode,IntersectVariant ivariant,
          TestType ty)

{
  undefined4 in_ECX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined1 in_stack_ffffffffffffffb7;
  TestType in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  Test *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,in_RSI);
  Test::Test(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  *in_RDI = &PTR__IntersectTest_005b0b00;
  *(undefined4 *)(in_RDI + 8) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x44) = in_R8D;
  return;
}

Assistant:

IntersectTest (std::string name, int isa, IntersectMode imode, IntersectVariant ivariant, TestType ty = TEST_SHOULD_PASS)
        : Test(name,isa,ty), imode(imode), ivariant(ivariant) {}